

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_generators.hpp
# Opt level: O3

void __thiscall
Catch::Generators::Generators<fd::AccuracyOrder>::add_generator
          (Generators<fd::AccuracyOrder> *this,AccuracyOrder *val)

{
  iterator __position;
  GeneratorPtr<fd::AccuracyOrder> in_RAX;
  GeneratorWrapper<fd::AccuracyOrder> local_18;
  
  local_18.m_generator.m_ptr =
       (GeneratorPtr<fd::AccuracyOrder>)(GeneratorPtr<fd::AccuracyOrder>)in_RAX.m_ptr;
  value<fd::AccuracyOrder,fd::AccuracyOrder>((Generators *)&local_18,val);
  __position._M_current =
       (this->m_generators).
       super__Vector_base<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>,_std::allocator<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_generators).
      super__Vector_base<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>,_std::allocator<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>,std::allocator<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>>>
    ::_M_realloc_insert<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>>
              ((vector<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>,std::allocator<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>>>
                *)&this->m_generators,__position,&local_18);
    if (local_18.m_generator.m_ptr != (IGenerator<fd::AccuracyOrder> *)0x0) {
      (**(code **)(*(long *)local_18.m_generator.m_ptr + 0x18))();
    }
  }
  else {
    ((__position._M_current)->m_generator).m_ptr =
         (IGenerator<fd::AccuracyOrder> *)local_18.m_generator.m_ptr;
    (this->m_generators).
    super__Vector_base<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>,_std::allocator<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void add_generator( T&& val ) {
            m_generators.emplace_back( value( CATCH_MOVE( val ) ) );
        }